

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O3

int32_t zng_inflateGetDictionary(zng_stream *strm,uint8_t *dictionary,uint32_t *dictLength)

{
  internal_state *piVar1;
  int iVar2;
  int32_t iVar3;
  
  iVar2 = inflateStateCheck(strm);
  iVar3 = -2;
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (dictionary != (uint8_t *)0x0 && piVar1->w_mask != 0) {
      memcpy(dictionary,(void *)((ulong)piVar1->lookahead + *(long *)&piVar1->high_water),
             (ulong)(piVar1->w_mask - piVar1->lookahead));
      memcpy(dictionary + ((ulong)piVar1->w_mask - (ulong)piVar1->lookahead),
             *(void **)&piVar1->high_water,(ulong)piVar1->lookahead);
    }
    iVar3 = 0;
    if (dictLength != (uint32_t *)0x0) {
      *dictLength = piVar1->w_mask;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateGetDictionary)(PREFIX3(stream) *strm, uint8_t *dictionary, uint32_t *dictLength) {
    struct inflate_state *state;

    /* check state */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;

    INFLATE_GET_DICTIONARY_HOOK(strm, dictionary, dictLength);  /* hook for IBM Z DFLTCC */

    /* copy dictionary */
    if (state->whave && dictionary != NULL) {
        memcpy(dictionary, state->window + state->wnext, state->whave - state->wnext);
        memcpy(dictionary + state->whave - state->wnext, state->window, state->wnext);
    }
    if (dictLength != NULL)
        *dictLength = state->whave;
    return Z_OK;
}